

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise1D::forward
          (ConvolutionDepthWise1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  reference opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Option *in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  size_t in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe80;
  Mat *dst;
  Mat *this_00;
  Mat local_138;
  const_reference in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff18;
  Mat *in_stack_ffffffffffffff20;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  Option *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Mat *in_stack_ffffffffffffff68;
  ConvolutionDepthWise1D *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int iVar4;
  int iVar5;
  int local_4;
  
  dst = (Mat *)0x0;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  opt_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(size_type)dst);
  iVar5 = pvVar3->w;
  iVar4 = pvVar3->c;
  this_00 = (Mat *)&stack0xffffffffffffff70;
  ncnn::Mat::Mat(this_00);
  flatten(this_00,dst,in_RDI);
  bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  if (bVar2) {
    local_4 = -100;
    goto LAB_0095038b;
  }
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff18);
  iVar1._0_1_ = in_RDI[3].use_subgroup_shuffle;
  iVar1._1_1_ = in_RDI[3].use_image_storage;
  iVar1._2_1_ = in_RDI[3].use_tensor_storage;
  iVar1._3_1_ = in_RDI[3].use_weight_fp16_storage;
  if (iVar1 == 0) {
LAB_00950176:
    ncnn::Mat::Mat(&local_138);
    make_padding(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    if (bVar2) {
      local_4 = -100;
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                        (int)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
      ;
      if (bVar2) {
        local_4 = -100;
      }
      else {
        local_4 = convolutiondepthwise1d
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                             (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                             (int)in_stack_ffffffffffffff10,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                             (Mat *)CONCAT44(iVar5,iVar4),(Option *)opt_00);
        if (local_4 == 0) {
          local_4 = 0;
        }
      }
    }
    ncnn::Mat::~Mat((Mat *)0x95036d);
  }
  else {
    in_stack_ffffffffffffff10 =
         std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
    flatten(this_00,dst,in_RDI);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    if (!bVar2) goto LAB_00950176;
    local_4 = -100;
  }
  ncnn::Mat::~Mat((Mat *)0x95037a);
LAB_0095038b:
  ncnn::Mat::~Mat((Mat *)0x950398);
  return local_4;
}

Assistant:

int ConvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}